

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

wally_psbt * cfd::core::MergePsbt(void *src,void *dest,bool ignore_duplicate_error)

{
  long lVar1;
  wally_psbt *pwVar2;
  CfdException *pCVar3;
  wally_psbt *psbt;
  int ret;
  undefined1 local_58 [32];
  wally_psbt *local_38;
  int local_2c;
  
  lVar1 = *(long *)((long)src + 8);
  if (((lVar1 == 0) || (*(long *)((long)src + 0x18) != *(long *)(lVar1 + 0x10))) ||
     (*(long *)((long)src + 0x30) != *(long *)(lVar1 + 0x28))) {
    local_58._0_8_ = "cfdcore_psbt.cpp";
    local_58._8_4_ = 0x2d1;
    local_58._16_8_ = "MergePsbt";
    logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"psbt src format error.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"psbt src format error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_58);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar1 = *(long *)((long)dest + 8);
  if (((lVar1 != 0) && (*(long *)((long)dest + 0x18) == *(long *)(lVar1 + 0x10))) &&
     (*(long *)((long)dest + 0x30) == *(long *)(lVar1 + 0x28))) {
    local_38 = (wally_psbt *)0x0;
    local_2c = wally_psbt_clone_alloc((wally_psbt *)src,0,&local_38);
    pwVar2 = local_38;
    if (local_2c != 0) {
      local_58._0_8_ = "cfdcore_psbt.cpp";
      local_58._8_4_ = 0x2de;
      local_58._16_8_ = "MergePsbt";
      logger::log<int&>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,
                        "wally_psbt_clone_alloc NG[{}]",&local_2c);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"psbt clone error.","");
      CfdException::CfdException(pCVar3,kCfdMemoryFullError,(string *)local_58);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (local_38->magic[4] == *(uchar *)((long)dest + 4) && *(int *)local_38->magic == *dest) {
      if (local_38->version == *(uint32_t *)((long)dest + 0x58)) {
        local_58._0_8_ = local_58 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"global unknowns","");
        MergeWallyMap(&pwVar2->unknowns,(wally_map *)((long)dest + 0x40),(string *)local_58,
                      ignore_duplicate_error);
        if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
          operator_delete((void *)local_58._0_8_);
        }
        MergePsbtInputs(local_38,(wally_psbt *)dest,ignore_duplicate_error);
        MergePsbtOutputs(local_38,(wally_psbt *)dest,ignore_duplicate_error);
        return local_38;
      }
      local_58._0_8_ = "cfdcore_psbt.cpp";
      local_58._8_4_ = 0x2ea;
      local_58._16_8_ = "MergePsbt";
      logger::log<unsigned_int&,unsigned_int_const&>
                ((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"psbt unmatch version: [{},{}]",
                 &local_38->version,(uint *)((long)dest + 0x58));
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      local_58._0_8_ = local_58 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,"psbt unmatch version error.","");
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_58);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_58._0_8_ = "cfdcore_psbt.cpp";
    local_58._8_4_ = 0x2e4;
    local_58._16_8_ = "MergePsbt";
    logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"psbt unmatch magic.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"psbt unmatch magic error.","");
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_58);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_58._0_8_ = "cfdcore_psbt.cpp";
  local_58._8_4_ = 0x2d7;
  local_58._16_8_ = "MergePsbt";
  logger::log<>((CfdSourceLocation *)local_58,kCfdLogLevelWarning,"psbt dest format error.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._0_8_ = local_58 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"psbt dest format error.","")
  ;
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_58);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

struct wally_psbt *MergePsbt(
    const void *src, const void *dest, bool ignore_duplicate_error) {
  const struct wally_psbt *psbt_src =
      static_cast<const struct wally_psbt *>(src);
  const struct wally_psbt *psbt_dest =
      static_cast<const struct wally_psbt *>(dest);

  if ((psbt_src->tx == nullptr) ||
      (psbt_src->num_inputs != psbt_src->tx->num_inputs) ||
      (psbt_src->num_outputs != psbt_src->tx->num_outputs)) {
    warn(CFD_LOG_SOURCE, "psbt src format error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt src format error.");
  }
  if ((psbt_dest->tx == nullptr) ||
      (psbt_dest->num_inputs != psbt_dest->tx->num_inputs) ||
      (psbt_dest->num_outputs != psbt_dest->tx->num_outputs)) {
    warn(CFD_LOG_SOURCE, "psbt dest format error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt dest format error.");
  }

  struct wally_psbt *psbt = nullptr;
  int ret = wally_psbt_clone_alloc(psbt_src, 0, &psbt);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_clone_alloc NG[{}]", ret);
    throw CfdException(kCfdMemoryFullError, "psbt clone error.");
  }

  try {
    if (memcmp(psbt->magic, psbt_dest->magic, sizeof(psbt->magic)) != 0) {
      warn(CFD_LOG_SOURCE, "psbt unmatch magic.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt unmatch magic error.");
    }
    if (psbt->version != psbt_dest->version) {
      warn(
          CFD_LOG_SOURCE, "psbt unmatch version: [{},{}]", psbt->version,
          psbt_dest->version);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt unmatch version error.");
    }
    MergeWallyMap(
        &psbt->unknowns, &psbt_dest->unknowns, "global unknowns",
        ignore_duplicate_error);

    MergePsbtInputs(psbt, psbt_dest, ignore_duplicate_error);
    MergePsbtOutputs(psbt, psbt_dest, ignore_duplicate_error);
  } catch (const CfdException &except) {
    wally_psbt_free(psbt);
    throw except;
  }
  return psbt;
}